

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void cfd::core::SetPsbtTxInScriptAndKeyList
               (wally_psbt_input *input,bool is_witness,Script *redeem_script,
               vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list,
               Script *locking_script)

{
  pointer puVar1;
  bool bVar2;
  CfdException *pCVar3;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  int local_bc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  Script local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ByteData local_48;
  
  bVar2 = Script::IsEmpty(redeem_script);
  if (!bVar2) {
    Script::GetData((ByteData *)&local_a0,redeem_script);
    ByteData::GetBytes(&local_b8,(ByteData *)&local_a0);
    if (local_a0._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_a0._vptr_Script);
    }
    if (is_witness) {
      bVar2 = Script::IsP2wpkhScript(redeem_script);
      if (!bVar2) {
        local_bc = wally_psbt_input_set_witness_script
                             (input,local_b8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_b8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        if (local_bc != 0) {
          local_a0._vptr_Script = (_func_int **)0x59b23b;
          local_a0.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0xfa;
          local_a0.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "SetPsbtTxInScriptAndKeyList";
          logger::log<int&>((CfdSourceLocation *)&local_a0,kCfdLogLevelWarning,
                            "wally_psbt_input_set_witness_script NG[{}]",&local_bc);
          pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
          local_a0._vptr_Script =
               (_func_int **)
               ((long)&local_a0.script_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"psbt add witness script error.","");
          CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_a0);
          __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
        }
        bVar2 = Script::IsP2shScript(locking_script);
        if (bVar2) {
          ScriptUtil::CreateP2wshLockingScript(&local_a0,redeem_script);
          Script::GetData(&local_48,&local_a0);
          ByteData::GetBytes(&local_68,&local_48);
          puVar1 = local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (uchar *)0x0;
          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (uchar *)0x0;
          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar1 != (uchar *)0x0) {
            operator_delete(puVar1);
          }
          if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (uchar *)0x0) {
            operator_delete(local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          Script::~Script(&local_a0);
        }
        else if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish !=
                 local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start) {
          local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
      }
    }
    if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_bc = wally_psbt_input_set_redeem_script
                           (input,local_b8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_b8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      if (local_bc != 0) {
        local_a0._vptr_Script = (_func_int **)0x59b23b;
        local_a0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x10a;
        local_a0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetPsbtTxInScriptAndKeyList";
        logger::log<int&>((CfdSourceLocation *)&local_a0,kCfdLogLevelWarning,
                          "wally_psbt_input_set_redeem_script NG[{}]",&local_bc);
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        local_a0._vptr_Script =
             (_func_int **)
             ((long)&local_a0.script_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"psbt add redeem script error.","");
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_a0);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((key_list->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (key_list->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    SetKeyPathMap(key_list,&input->keypaths);
    local_bc = wally_map_sort(&input->keypaths,0);
    if (local_bc != 0) {
      local_a0._vptr_Script = (_func_int **)0x59b23b;
      local_a0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x115;
      local_a0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = "SetPsbtTxInScriptAndKeyList";
      logger::log<int&>((CfdSourceLocation *)&local_a0,kCfdLogLevelWarning,"wally_map_sort NG[{}]",
                        &local_bc);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_a0._vptr_Script =
           (_func_int **)
           ((long)&local_a0.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"psbt input sort keypaths error.","");
      CfdException::CfdException(pCVar3,kCfdInternalError,(string *)&local_a0);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  return;
}

Assistant:

void SetPsbtTxInScriptAndKeyList(
    struct wally_psbt_input *input, bool is_witness,
    const Script &redeem_script, const std::vector<KeyData> &key_list,
    const Script &locking_script) {
  int ret;
  if (!redeem_script.IsEmpty()) {
    auto script_val = redeem_script.GetData().GetBytes();
    if (is_witness && (!redeem_script.IsP2wpkhScript())) {
      ret = wally_psbt_input_set_witness_script(
          input, script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(
            CFD_LOG_SOURCE, "wally_psbt_input_set_witness_script NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add witness script error.");
      }
      if (locking_script.IsP2shScript()) {
        script_val = ScriptUtil::CreateP2wshLockingScript(redeem_script)
                         .GetData()
                         .GetBytes();
      } else {
        script_val.clear();
      }
    }
    if (!script_val.empty()) {
      ret = wally_psbt_input_set_redeem_script(
          input, script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_psbt_input_set_redeem_script NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add redeem script error.");
      }
    }
  }

  if (!key_list.empty()) {
    SetKeyPathMap(key_list, &input->keypaths);
    ret = wally_map_sort(&input->keypaths, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt input sort keypaths error.");
    }
  }
}